

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# render-data.cc
# Opt level: O0

string * __thiscall
tinyusdz::tydra::to_string_abi_cxx11_(string *__return_storage_ptr__,tydra *this,ComponentType cty)

{
  ComponentType cty_local;
  string *s;
  
  ::std::__cxx11::string::string((string *)__return_storage_ptr__);
  switch((ulong)this & 0xffffffff) {
  case 0:
    ::std::__cxx11::string::operator=((string *)__return_storage_ptr__,"uint8");
    break;
  case 1:
    ::std::__cxx11::string::operator=((string *)__return_storage_ptr__,"int8");
    break;
  case 2:
    ::std::__cxx11::string::operator=((string *)__return_storage_ptr__,"uint16");
    break;
  case 3:
    ::std::__cxx11::string::operator=((string *)__return_storage_ptr__,"int16");
    break;
  case 4:
    ::std::__cxx11::string::operator=((string *)__return_storage_ptr__,"uint32");
    break;
  case 5:
    ::std::__cxx11::string::operator=((string *)__return_storage_ptr__,"int32");
    break;
  case 6:
    ::std::__cxx11::string::operator=((string *)__return_storage_ptr__,"half");
    break;
  case 7:
    ::std::__cxx11::string::operator=((string *)__return_storage_ptr__,"float");
    break;
  case 8:
    ::std::__cxx11::string::operator=((string *)__return_storage_ptr__,"double");
  }
  return __return_storage_ptr__;
}

Assistant:

std::string to_string(ComponentType cty) {
  std::string s;
  switch (cty) {
    case ComponentType::UInt8: {
      s = "uint8";
      break;
    }
    case ComponentType::Int8: {
      s = "int8";
      break;
    }
    case ComponentType::UInt16: {
      s = "uint16";
      break;
    }
    case ComponentType::Int16: {
      s = "int16";
      break;
    }
    case ComponentType::UInt32: {
      s = "uint32";
      break;
    }
    case ComponentType::Int32: {
      s = "int32";
      break;
    }
    case ComponentType::Half: {
      s = "half";
      break;
    }
    case ComponentType::Float: {
      s = "float";
      break;
    }
    case ComponentType::Double: {
      s = "double";
      break;
    }
  }

  return s;
}